

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CBasicVertexInstancingDef::Run<glcts::(anonymous_namespace)::test_api::ES3>
          (CBasicVertexInstancingDef *this)

{
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  GLuint GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  runtime_error *this_01;
  size_type *psVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  void *pointer;
  value_type *__value;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  CColorArray coords;
  CElementArray elements;
  CColorArray bufferTest;
  CColorArray bufferRef1;
  CColorArray bufferRef2;
  DrawArraysIndirectCommand indirectArrays;
  DIResult result;
  allocator_type local_889;
  undefined1 local_888 [16];
  pointer local_878;
  value_type *local_870;
  string local_868;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_848;
  undefined8 *local_830;
  string local_828;
  string local_808;
  undefined1 local_7e8 [16];
  undefined4 local_7d8;
  undefined1 auStack_7d4 [12];
  undefined4 local_7c8;
  undefined1 local_7b8 [4];
  undefined1 auStack_7b4 [12];
  undefined7 local_7a8;
  undefined1 uStack_7a1;
  undefined7 uStack_7a0;
  undefined1 local_799;
  long local_638;
  DILogger local_630;
  DILogger local_4b0;
  DILogger local_330;
  DILogger local_1b0;
  
  local_888 = (undefined1  [16])0x0;
  local_878 = (pointer)0x0;
  DrawIndirectBase::PrimitiveGen
            (&this->super_DrawIndirectBase,4,this->_drawSizeX,this->_drawSizeY,
             (CColorArray *)local_888);
  local_830 = (undefined8 *)operator_new(0x40);
  *local_830 = &DAT_3f0000003f000000;
  local_830[1] = 0;
  local_830[2] = 0x3f000000bf000000;
  local_830[3] = 0;
  local_830[4] = 0xbf000000bf000000;
  local_830[5] = 0;
  local_830[6] = 0xbf0000003f000000;
  local_830[7] = 0;
  local_870 = (value_type *)operator_new(0x20);
  local_870->m_data[0] = 1.0;
  local_870->m_data[1] = 0.0;
  local_870->m_data[2] = 0.0;
  local_870->m_data[3] = 1.0;
  local_870[1].m_data[0] = 0.0;
  local_870[1].m_data[1] = 1.0;
  local_870[1].m_data[2] = 0.0;
  local_870[1].m_data[3] = 1.0;
  local_7a8 = 0x6f697372657623;
  uStack_7a1 = 0x6e;
  uStack_7a0 = 0x73652030313320;
  auStack_7b4._4_4_ = 2.10195e-44;
  auStack_7b4._8_4_ = 0.0;
  _local_7b8 = &local_7a8;
  local_799 = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_7b8);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_868.field_2._M_allocated_capacity = *psVar8;
    local_868.field_2._8_8_ = plVar7[3];
    local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  }
  else {
    local_868.field_2._M_allocated_capacity = *psVar8;
    local_868._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_868._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (_local_7b8 != &local_7a8) {
    operator_delete(_local_7b8,CONCAT17(uStack_7a1,local_7a8) + 1);
  }
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,0x1af8059);
  local_7a8 = 0x6f697372657623;
  uStack_7a1 = 0x6e;
  uStack_7a0 = 0x73652030313320;
  auStack_7b4._4_4_ = 2.10195e-44;
  auStack_7b4._8_4_ = 0.0;
  _local_7b8 = &local_7a8;
  local_799 = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_7b8);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_808.field_2._M_allocated_capacity = *psVar8;
    local_808.field_2._8_8_ = plVar7[3];
    local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  }
  else {
    local_808.field_2._M_allocated_capacity = *psVar8;
    local_808._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_808._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (_local_7b8 != &local_7a8) {
    operator_delete(_local_7b8,CONCAT17(uStack_7a1,local_7a8) + 1);
  }
  __value = local_870;
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_868,&local_828,&local_808,true);
  this->_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar9 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_vbo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_888._8_8_ + (0x60 - local_888._0_8_),(void *)0x0,0x88e4);
    pointer = (void *)(local_888._8_8_ - local_888._0_8_);
    glu::CallLogWrapper::glBufferSubData
              (this_00,0x8892,0,(GLsizeiptr)pointer,(void *)local_888._0_8_);
    glu::CallLogWrapper::glBufferSubData(this_00,0x8892,(GLintptr)pointer,0x40,local_830);
    glu::CallLogWrapper::glBufferSubData
              (this_00,0x8892,(GLintptr)((long)pointer + 0x40),0x20,local_870);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0,pointer);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glVertexAttribDivisor(this_00,1,1);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,2,4,0x1406,'\0',0,(void *)((long)pointer + 0x40));
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
    glu::CallLogWrapper::glVertexAttribDivisor(this_00,2,3);
    local_7e8 = (undefined1  [16])0x0;
    local_7c8 = 0;
    local_7d8 = 0;
    auStack_7d4 = SUB1612((undefined1  [16])0x0,4);
    auVar1._12_4_ = 0;
    auVar1._0_12_ = auStack_7b4;
    _local_7b8 = (float  [4])(auVar1 << 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_868,
               (long)(local_888._8_8_ - local_888._0_8_) >> 4,(value_type_conflict4 *)local_7b8,
               (allocator_type *)&local_828);
    __value = local_870;
    auVar1 = _DAT_019f5ce0;
    if (local_868._M_string_length - (long)local_868._M_dataplus._M_p != 0) {
      lVar9 = (long)(local_868._M_string_length - (long)local_868._M_dataplus._M_p) >> 2;
      lVar9 = lVar9 + (ulong)(lVar9 == 0);
      lVar10 = lVar9 + -1;
      auVar12._8_4_ = (int)lVar10;
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar12 = auVar12 ^ _DAT_019f5ce0;
      auVar13 = _DAT_019fcc00;
      do {
        auVar14 = auVar13 ^ auVar1;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          *(int *)(local_868._M_dataplus._M_p + uVar11 * 4) = (int)uVar11;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          *(int *)(local_868._M_dataplus._M_p + uVar11 * 4 + 4) = (int)uVar11 + 1;
        }
        uVar11 = uVar11 + 2;
        lVar10 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar10 + 2;
      } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar11);
    }
    if (this->_drawFunc == DRAW_ARRAYS) {
      local_7e8._4_8_ = 4;
      local_7e8._0_4_ = (int)((ulong)(local_888._8_8_ - local_888._0_8_) >> 4);
      local_7e8._12_4_ = 0;
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)local_7b8);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,(GLuint)local_7b8);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,local_7e8,0x88e4);
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)local_7b8);
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_7d8 = (undefined4)((ulong)(local_888._8_8_ - local_888._0_8_) >> 4);
      auStack_7d4 = SUB1612(ZEXT416(4),0);
      local_7c8 = 0;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,local_868._M_string_length - (long)local_868._M_dataplus._M_p,
                 local_868._M_dataplus._M_p,0x88e4);
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)local_7b8);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,(GLuint)local_7b8);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_7d8,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)local_7b8);
    }
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_828,
               (long)(((iVar3 / 2) * *(int *)(CONCAT44(extraout_var_00,iVar4) + 4)) / 2),__value,
               (allocator_type *)local_7b8);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_808,
               (long)(((iVar3 / 2) * *(int *)(CONCAT44(extraout_var_02,iVar4) + 4)) / 2),__value + 1
               ,(allocator_type *)local_7b8);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_03,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_7b8 = (undefined1  [4])0x0;
    auStack_7b4._0_4_ = 0.0;
    auStack_7b4._4_4_ = 0.0;
    auStack_7b4._8_4_ = 0.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_848,(long)(((iVar3 / 2) * *(int *)(CONCAT44(extraout_var_04,iVar4) + 4)) / 2),
               (value_type *)local_7b8,&local_889);
    auVar14[0xf] = 0;
    auVar14._0_15_ = stack0xfffffffffffff849;
    _local_7b8 = (float  [4])(auVar14 << 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_7b4 + 4));
    local_638 = 0;
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_05,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              (&this->super_DrawIndirectBase,0,0,iVar3 / 2,
               *(int *)(CONCAT44(extraout_var_06,iVar4) + 4) / 2,
               local_848.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_07,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_08,iVar4) + 4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var_09,iVar5);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)
                       ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)
                       ->m_renderCtx,&local_848,iVar3 / 2,iVar4 / 2,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &local_828,iVar5 / 2,*(int *)(CONCAT44(extraout_var_10,iVar6) + 4) / 2);
    DIResult::sub_result(&local_1b0,(DIResult *)local_7b8,lVar9);
    DILogger::~DILogger(&local_1b0);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_11,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var_12,iVar4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              (&this->super_DrawIndirectBase,(iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1,0,iVar4 / 2,
               *(int *)(CONCAT44(extraout_var_13,iVar5) + 4) / 2,
               local_848.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_14,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_15,iVar4) + 4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var_16,iVar5);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)
                       ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)
                       ->m_renderCtx,&local_848,iVar3 / 2,iVar4 / 2,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &local_808,iVar5 / 2,*(int *)(CONCAT44(extraout_var_17,iVar6) + 4) / 2);
    DIResult::sub_result(&local_330,(DIResult *)local_7b8,lVar9);
    DILogger::~DILogger(&local_330);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)(CONCAT44(extraout_var_18,iVar3) + 4);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var_19,iVar4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              (&this->super_DrawIndirectBase,0,(iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1,iVar4 / 2,
               *(int *)(CONCAT44(extraout_var_20,iVar5) + 4) / 2,
               local_848.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_21,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_22,iVar4) + 4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var_23,iVar5);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)
                       ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)
                       ->m_renderCtx,&local_848,iVar3 / 2,iVar4 / 2,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &local_828,iVar5 / 2,*(int *)(CONCAT44(extraout_var_24,iVar6) + 4) / 2);
    DIResult::sub_result(&local_4b0,(DIResult *)local_7b8,lVar9);
    DILogger::~DILogger(&local_4b0);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_25,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_26,iVar4) + 4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var_27,iVar5);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              (&this->super_DrawIndirectBase,(iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1,
               (iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1,iVar5 / 2,
               *(int *)(CONCAT44(extraout_var_28,iVar6) + 4) / 2,
               local_848.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_29,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_30,iVar4) + 4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var_31,iVar5);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)
                       ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)
                       ->m_renderCtx,&local_848,iVar3 / 2,iVar4 / 2,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &local_828,iVar5 / 2,*(int *)(CONCAT44(extraout_var_32,iVar6) + 4) / 2);
    DIResult::sub_result(&local_630,(DIResult *)local_7b8,lVar9);
    DILogger::~DILogger(&local_630);
    lVar9 = local_638;
    DILogger::~DILogger((DILogger *)local_7b8);
    if (local_848.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_848.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_848.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_848.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_808._M_dataplus._M_p,
                      local_808.field_2._M_allocated_capacity - (long)local_808._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_828._M_dataplus._M_p,
                      local_828.field_2._M_allocated_capacity - (long)local_828._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_868._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_868._M_dataplus._M_p,
                      local_868.field_2._M_allocated_capacity - (long)local_868._M_dataplus._M_p);
    }
  }
  operator_delete(__value,0x20);
  operator_delete(local_830,0x40);
  if ((pointer)local_888._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_888._0_8_,(long)local_878 - local_888._0_8_);
  }
  return lVar9;
}

Assistant:

long Run()
	{
		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, _drawSizeX, _drawSizeY, coords);

		CColorArray coords_instanced(4);
		coords_instanced[0] = tcu::Vec4(0.5, 0.5, 0.0, 0.0);
		coords_instanced[1] = tcu::Vec4(-0.5, 0.5, 0.0, 0.0);
		coords_instanced[2] = tcu::Vec4(-0.5, -0.5, 0.0, 0.0);
		coords_instanced[3] = tcu::Vec4(0.5, -0.5, 0.0, 0.0);

		CColorArray colors_instanced(2);
		colors_instanced[0] = tcu::Vec4(1.0, 0.0, 0.0, 1.0);
		colors_instanced[1] = tcu::Vec4(0.0, 1.0, 0.0, 1.0);

		_program = CreateProgram(Vsh<api>(), "", Fsh<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenBuffers(1, &_vbo);
		glBindBuffer(GL_ARRAY_BUFFER, _vbo);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0]) +
												   coords_instanced.size() * sizeof(coords_instanced[0]) +
												   colors_instanced.size() * sizeof(colors_instanced[0])),
					 NULL, GL_STATIC_DRAW);

		const size_t coords_offset			 = 0;
		const size_t coords_instanced_offset = coords_offset + coords.size() * sizeof(coords[0]);
		const size_t colors_instanced_offset =
			coords_instanced_offset + coords_instanced.size() * sizeof(coords_instanced[0]);

		glBufferSubData(GL_ARRAY_BUFFER, coords_offset, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0]);
		glBufferSubData(GL_ARRAY_BUFFER, (GLintptr)coords_instanced_offset,
						(GLsizeiptr)(coords_instanced.size() * sizeof(coords_instanced[0])), &coords_instanced[0]);
		glBufferSubData(GL_ARRAY_BUFFER, (GLintptr)colors_instanced_offset,
						(GLsizeiptr)(colors_instanced.size() * sizeof(colors_instanced[0])), &colors_instanced[0]);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		//i_vertex (coords)
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, reinterpret_cast<glw::GLvoid*>(coords_offset));
		glEnableVertexAttribArray(0);

		//i_vertex_instanced (coords_instanced)
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 0, reinterpret_cast<glw::GLvoid*>(coords_instanced_offset));
		glEnableVertexAttribArray(1);
		glVertexAttribDivisor(1, 1);

		//i_vertex_color_instanced (color_instanced)
		glVertexAttribPointer(2, 4, GL_FLOAT, GL_FALSE, 0, reinterpret_cast<glw::GLvoid*>(colors_instanced_offset));
		glEnableVertexAttribArray(2);
		glVertexAttribDivisor(2, 3);

		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };
		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			indirectArrays.count			  = static_cast<GLuint>(coords.size());
			indirectArrays.primCount		  = 4;
			indirectArrays.first			  = 0;
			indirectArrays.reservedMustBeZero = 0;

			{
				GLuint buffer;
				glGenBuffers(1, &buffer);
				glBindBuffer(GL_DRAW_INDIRECT_BUFFER, buffer);
				glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(indirectArrays), &indirectArrays, GL_STATIC_DRAW);
				glDrawArraysIndirect(GL_TRIANGLES, 0);
				glDeleteBuffers(1, &buffer);
			}
		}
		break;
		case DRAW_ELEMENTS:
		{
			indirectElements.count				= static_cast<GLuint>(coords.size());
			indirectElements.primCount			= 4;
			indirectElements.firstIndex			= 0;
			indirectElements.baseVertex			= 0;
			indirectElements.reservedMustBeZero = 0;

			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			{
				GLuint buffer;
				glGenBuffers(1, &buffer);
				glBindBuffer(GL_DRAW_INDIRECT_BUFFER, buffer);
				glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(indirectElements), &indirectElements, GL_STATIC_DRAW);
				glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);
				glDeleteBuffers(1, &buffer);
			}
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef1(getWindowWidth() / 2 * getWindowHeight() / 2, colors_instanced[0]);
		CColorArray bufferRef2(getWindowWidth() / 2 * getWindowHeight() / 2, colors_instanced[1]);

		CColorArray bufferTest(getWindowWidth() / 2 * getWindowHeight() / 2, tcu::Vec4(0.0f));
		DIResult	result;

		ReadPixelsFloat<api>(0, 0, getWindowWidth() / 2, getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth() / 2, getWindowHeight() / 2, bufferRef1,
										 getWindowWidth() / 2, getWindowHeight() / 2));

		ReadPixelsFloat<api>((getWindowWidth() + 1) / 2, 0, getWindowWidth() / 2, getWindowHeight() / 2,
							 &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth() / 2, getWindowHeight() / 2, bufferRef2,
										 getWindowWidth() / 2, getWindowHeight() / 2));

		ReadPixelsFloat<api>(0, (getWindowHeight() + 1) / 2, getWindowWidth() / 2, getWindowHeight() / 2,
							 &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth() / 2, getWindowHeight() / 2, bufferRef1,
										 getWindowWidth() / 2, getWindowHeight() / 2));

		ReadPixelsFloat<api>((getWindowWidth() + 1) / 2, (getWindowHeight() + 1) / 2, getWindowWidth() / 2,
							 getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth() / 2, getWindowHeight() / 2, bufferRef1,
										 getWindowWidth() / 2, getWindowHeight() / 2));

		return result.code();
	}